

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11ResourceULT.cpp
# Opt level: O0

void __thiscall
CTestGen11Resource_TestPlanar2D_NV12_Test::TestBody(CTestGen11Resource_TestPlanar2D_NV12_Test *this)

{
  uint32_t uVar1;
  bool bVar2;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  char *pcVar3;
  AssertHelper local_258;
  Message local_250;
  unsigned_long local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_7;
  Message local_228;
  unsigned_long local_220;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_6;
  Message local_200;
  unsigned_long local_1f8;
  uint local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_5;
  Message local_1d0;
  unsigned_long local_1c8;
  uint local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_4;
  Message local_1a0;
  undefined8 local_198;
  undefined4 local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_3;
  Message local_170;
  undefined8 local_168;
  undefined4 local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_2;
  Message local_140;
  undefined8 local_138;
  undefined4 local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  Message local_110 [3];
  undefined8 local_f8;
  undefined4 local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  int local_d0;
  uint32_t Size;
  uint32_t Height;
  uint32_t Pitch;
  GMM_RESOURCE_INFO *ResourceInfo;
  GMM_RESCREATE_PARAMS gmmParams;
  TEST_TILE_TYPE Tile;
  uint32_t TileIndex;
  uint32_t TileSize [3] [2];
  TEST_TILE_TYPE TileTypes [3];
  CTestGen11Resource_TestPlanar2D_NV12_Test *this_local;
  
  stack0xffffffffffffffe4 = 0x100000000;
  _Tile = 0x100000001;
  TileSize[0][0] = 0x200;
  TileSize[0][1] = 8;
  TileSize[1][0] = 0x80;
  TileSize[1][1] = 0x20;
  for (gmmParams.MultiTileArch.Reserved = 0; gmmParams.MultiTileArch.Reserved < 3;
      gmmParams.MultiTileArch.Reserved = gmmParams.MultiTileArch.Reserved + 1) {
    gmmParams.MultiTileArch._0_4_ = TileSize[2][(ulong)gmmParams.MultiTileArch.Reserved + 1];
    memset(&ResourceInfo,0,0x80);
    ResourceInfo._0_4_ = 2;
    gmmParams.ExistingSysMemSize._4_1_ = 1;
    gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffffbffffffff | 0x400000000;
    gmmParams.CpTag = 0x100;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 0x100;
    gmmParams.field_6.BaseWidth64._4_4_ = 1;
    CTestResource::SetTileFlag
              ((CTestResource *)this,(GMM_RESCREATE_PARAMS *)&ResourceInfo,
               gmmParams.MultiTileArch._0_4_);
    ResourceInfo._4_4_ = 0x15d;
    ResourceInfo_00 =
         (GMM_RESOURCE_INFO *)
         (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                   (CommonULT::pGmmULTClientContext,&ResourceInfo);
    uVar1 = gmmParams.CpTag;
    if (gmmParams.MultiTileArch._0_4_ == 0) {
      Size = (uVar1 + ((&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2] - TEST_TILEX)) -
             (uVar1 + ((&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2] - TEST_TILEX) &
             (&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2] - TEST_TILEX);
      local_d0 = (gmmParams.field_6.BaseWidth + (gmmParams.field_6.BaseWidth >> 1) +
                 (TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1)) -
                 (gmmParams.field_6.BaseWidth + (gmmParams.field_6.BaseWidth >> 1) +
                  (TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1) &
                 TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1);
    }
    else {
      Size = (uVar1 + ((&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2] - TEST_TILEX)) -
             (uVar1 + ((&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2] - TEST_TILEX) &
             (&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2] - TEST_TILEX);
      local_d0 = ((gmmParams.field_6.BaseWidth +
                  TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1]) -
                 (gmmParams.field_6.BaseWidth +
                  (TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1) &
                 TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1)) +
                 (((gmmParams.field_6.BaseWidth >> 1) +
                  (TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 2)) -
                 ((gmmParams.field_6.BaseWidth >> 1) +
                  (TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1) &
                 TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1));
    }
    gtest_ar.message_.ptr_._4_4_ = (Size * local_d0 + 0xfff) - (Size * local_d0 + 0xfff & 0xfff);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,ResourceInfo_00,Size);
    if (gmmParams.MultiTileArch._0_4_ != 0) {
      CTestResource::VerifyResourcePitchInTiles<true>
                ((CTestResource *)this,ResourceInfo_00,
                 Size / (&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2]);
    }
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,ResourceInfo_00,(ulong)gtest_ar.message_.ptr_._4_4_);
    CTestResource::VerifyResourceHAlign<false>((CTestResource *)this,ResourceInfo_00,0);
    CTestResource::VerifyResourceVAlign<false>((CTestResource *)this,ResourceInfo_00,0);
    CTestResource::VerifyResourceQPitch<false>((CTestResource *)this,ResourceInfo_00,0);
    local_ec = 0;
    local_f8 = (**(code **)(*(long *)ResourceInfo_00 + 0x210))(ResourceInfo_00,1);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_e8,"0",(int *)"ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y)",
               (unsigned_long *)&local_ec,&local_f8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
    if (!bVar2) {
      testing::Message::Message(local_110);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                 ,0x25e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
    local_12c = 0;
    local_138 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))(ResourceInfo_00,1);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_128,"0",(int *)"ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y)",
               (unsigned_long *)&local_12c,&local_138);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
    if (!bVar2) {
      testing::Message::Message(&local_140);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                 ,0x25f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_140);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_140);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    local_15c = 0;
    local_168 = (**(code **)(*(long *)ResourceInfo_00 + 0x210))(ResourceInfo_00,2);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_158,"0",(int *)"ResourceInfo->GetPlanarXOffset(GMM_PLANE_U)",
               (unsigned_long *)&local_15c,&local_168);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
    if (!bVar2) {
      testing::Message::Message(&local_170);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                 ,0x262,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_170);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_170);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
    local_18c = 0;
    local_198 = (**(code **)(*(long *)ResourceInfo_00 + 0x210))(ResourceInfo_00,3);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_188,"0",(int *)"ResourceInfo->GetPlanarXOffset(GMM_PLANE_V)",
               (unsigned_long *)&local_18c,&local_198);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar2) {
      testing::Message::Message(&local_1a0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                 ,0x263,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_1a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    if (gmmParams.MultiTileArch._0_4_ == 0) {
      local_220 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))(ResourceInfo_00,2);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_218,"gmmParams.BaseHeight",
                 "ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",&gmmParams.field_6.BaseWidth,
                 &local_220);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
      if (!bVar2) {
        testing::Message::Message(&local_228);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                   ,0x26c,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_228);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_228);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
      local_248 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))(ResourceInfo_00,3);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_240,"gmmParams.BaseHeight",
                 "ResourceInfo->GetPlanarYOffset(GMM_PLANE_V)",&gmmParams.field_6.BaseWidth,
                 &local_248);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
      if (!bVar2) {
        testing::Message::Message(&local_250);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
        testing::internal::AssertHelper::AssertHelper
                  (&local_258,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                   ,0x26d,pcVar3);
        testing::internal::AssertHelper::operator=(&local_258,&local_250);
        testing::internal::AssertHelper::~AssertHelper(&local_258);
        testing::Message::~Message(&local_250);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    }
    else {
      local_1bc = (TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1) +
                  gmmParams.field_6.BaseWidth &
                  -TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1];
      local_1c8 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))(ResourceInfo_00,2);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_1b8,
                 "(((gmmParams.BaseHeight) + ((TileSize[TileIndex][1]) - 1)) - (((gmmParams.BaseHeight) + ((TileSize[TileIndex][1]) - 1)) & ((TileSize[TileIndex][1]) - 1)))"
                 ,"ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",&local_1bc,&local_1c8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
      if (!bVar2) {
        testing::Message::Message(&local_1d0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                   ,0x267,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_1d0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
      local_1ec = (TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1) +
                  gmmParams.field_6.BaseWidth &
                  -TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1];
      local_1f8 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))(ResourceInfo_00,3);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_1e8,
                 "(((gmmParams.BaseHeight) + ((TileSize[TileIndex][1]) - 1)) - (((gmmParams.BaseHeight) + ((TileSize[TileIndex][1]) - 1)) & ((TileSize[TileIndex][1]) - 1)))"
                 ,"ResourceInfo->GetPlanarYOffset(GMM_PLANE_V)",&local_1ec,&local_1f8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
      if (!bVar2) {
        testing::Message::Message(&local_200);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                   ,0x268,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_200);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_200);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))();
  }
  return;
}

Assistant:

TEST_F(CTestGen11Resource, TestPlanar2D_NV12)
{
    /* Test planar surface with hybrid UV planes where UV plane is half the size
    of Y and U/V data is packed together */
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // [UV-Packing]
    const TEST_TILE_TYPE TileTypes[] = {TEST_LINEAR, TEST_TILEX, TEST_TILEY};

    const uint32_t TileSize[3][2] = {{1, 1},     //Linear
                                  {512, 8},   // TileX
                                  {128, 32}}; // TileY
    for(uint32_t TileIndex = 0; TileIndex < sizeof(TileTypes) / sizeof(TileTypes[0]); TileIndex++)
    {
        TEST_TILE_TYPE Tile = TileTypes[TileIndex];

        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Type                 = RESOURCE_2D;
        gmmParams.NoGfxMemory          = 1;
        gmmParams.Flags.Gpu.Texture    = 1;
        gmmParams.BaseWidth64          = 0x100;
        gmmParams.BaseHeight           = 0x100;
        gmmParams.Depth                = 0x1;
        SetTileFlag(gmmParams, static_cast<TEST_TILE_TYPE>(Tile));
        gmmParams.Format = GMM_FORMAT_NV12;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t Pitch, Height;

        if(Tile != TEST_LINEAR)
        {
            Pitch = GMM_ULT_ALIGN(gmmParams.BaseWidth64, TileSize[TileIndex][0]);

            Height = GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[TileIndex][1]) +
                     GMM_ULT_ALIGN(gmmParams.BaseHeight / 2, TileSize[TileIndex][1]);
        }
        else
        {
            Pitch  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, TileSize[TileIndex][0]);
            Height = GMM_ULT_ALIGN(gmmParams.BaseHeight /*Y*/ + gmmParams.BaseHeight / 2 /*UV*/, TileSize[TileIndex][1]);
        }

        uint32_t Size = GMM_ULT_ALIGN(Pitch * Height, GMM_KBYTE(4));

        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        if(Tile != TEST_LINEAR)
        {
            VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[TileIndex][0]);
        }
        VerifyResourceSize<true>(ResourceInfo, Size);
        VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for planar

        // Y plane should be at 0,0
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y));
        EXPECT_EQ(0, ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y));

        // U/V plane should be at end of Y plane
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_U));
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_V));

        if(Tile != TEST_LINEAR)
        {
            EXPECT_EQ(GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[TileIndex][1]), ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));
            EXPECT_EQ(GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[TileIndex][1]), ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));
        }
        else
        {
            EXPECT_EQ(gmmParams.BaseHeight, ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));
            EXPECT_EQ(gmmParams.BaseHeight, ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}